

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOSExe.cpp
# Opt level: O2

void __thiscall DOSExe::wrap(DOSExe *this)

{
  short sVar1;
  mapped_type pEVar2;
  int iVar3;
  int iVar4;
  DosHdrWrapper *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *ppEVar5;
  ExeException *pEVar6;
  key_type local_68;
  QString local_60;
  QString local_48;
  QString local_30;
  
  this_00 = (DosHdrWrapper *)operator_new(0x10);
  DosHdrWrapper::DosHdrWrapper(this_00,(Executable *)this);
  this->dosHdrWrapper = this_00;
  iVar3 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[7])(this,0,0x40,0);
  this->m_dosHdr = (IMAGE_DOS_HEADER *)CONCAT44(extraout_var,iVar3);
  if ((IMAGE_DOS_HEADER *)CONCAT44(extraout_var,iVar3) == (IMAGE_DOS_HEADER *)0x0) {
    pEVar6 = (ExeException *)__cxa_allocate_exception(0x48);
    QString::QString(&local_30,"Could not Wrap!");
    ExeException::ExeException(pEVar6,&local_30);
    __cxa_throw(pEVar6,&ExeException::typeinfo,CustomException::~CustomException);
  }
  iVar3 = (*(this->dosHdrWrapper->super_ExeElementWrapper).super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0x12])(this->dosHdrWrapper,0,0xffffffffffffffff);
  iVar4 = (*(this->dosHdrWrapper->super_ExeElementWrapper).super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  if (((short *)CONCAT44(extraout_var_00,iVar3) != (short *)0x0) &&
     (CONCAT44(extraout_var_01,iVar4) != 0)) {
    sVar1 = *(short *)CONCAT44(extraout_var_00,iVar3);
    if ((sVar1 != 0x4d5a) && (sVar1 != 0x5a4d)) {
      Logger::append(D_WARNING,"It is not a DOS file!\n");
      pEVar6 = (ExeException *)__cxa_allocate_exception(0x48);
      QString::QString(&local_60,"It is not a DOS file!");
      ExeException::ExeException(pEVar6,&local_60);
      __cxa_throw(pEVar6,&ExeException::typeinfo,CustomException::~CustomException);
    }
    pEVar2 = &this->dosHdrWrapper->super_ExeElementWrapper;
    local_68 = 0;
    ppEVar5 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](&(this->super_MappedExe).super_ExeWrappersContainer.wrappers,&local_68);
    *ppEVar5 = pEVar2;
    return;
  }
  pEVar6 = (ExeException *)__cxa_allocate_exception(0x48);
  QString::QString(&local_48,"Could not Wrap!");
  ExeException::ExeException(pEVar6,&local_48);
  __cxa_throw(pEVar6,&ExeException::typeinfo,CustomException::~CustomException);
}

Assistant:

void DOSExe::wrap()
{
    this->dosHdrWrapper = new DosHdrWrapper(this);

    m_dosHdr = (IMAGE_DOS_HEADER*) getContentAt(0, sizeof(IMAGE_DOS_HEADER));
    if (m_dosHdr == NULL) throw ExeException("Could not Wrap!");

    WORD* magic = (WORD*) this->dosHdrWrapper->getFieldPtr(DosHdrWrapper::MAGIC);

    if (this->dosHdrWrapper->getPtr() == NULL || magic == NULL) {
        throw ExeException("Could not Wrap!");
    }

    if ((*magic) != pe::S_DOS && (*magic) != pe::S_DOS2) {
        Logger::append(Logger::D_WARNING, "It is not a DOS file!\n");
        throw ExeException("It is not a DOS file!");
    }
    this->wrappers[WR_DOS_HDR] = this->dosHdrWrapper;
}